

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_initCStream_internal
                 (ZSTD_CStream *zcs,void *dict,size_t dictSize,ZSTD_CDict *cdict,
                 ZSTD_CCtx_params *params,unsigned_long_long pledgedSrcSize)

{
  undefined4 in_EAX;
  int iVar1;
  size_t sVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar9;
  uint uVar10;
  undefined1 in_XMM1 [16];
  undefined1 auVar8 [16];
  uint uVar11;
  
  zcs->streamStage = zcss_init;
  zcs->pledgedSrcSizePlusOne = pledgedSrcSize + 1;
  uVar3 = (params->cParams).windowLog - 0x20;
  uVar4 = (params->cParams).chainLog - 0x1f;
  uVar5 = (params->cParams).hashLog - 0x1f;
  uVar6 = (params->cParams).searchLog - 0x1f;
  auVar8 = pmovsxbd(in_XMM1,0xe1e6e6e9);
  uVar7 = auVar8._0_4_;
  uVar9 = auVar8._4_4_;
  uVar10 = auVar8._8_4_;
  uVar11 = auVar8._12_4_;
  auVar8._0_4_ = -(uint)(((uVar3 < uVar7) * uVar3 | (uVar3 >= uVar7) * uVar7) == uVar3);
  auVar8._4_4_ = -(uint)(((uVar4 < uVar9) * uVar4 | (uVar4 >= uVar9) * uVar9) == uVar4);
  auVar8._8_4_ = -(uint)(((uVar5 < uVar10) * uVar5 | (uVar5 >= uVar10) * uVar10) == uVar5);
  auVar8._12_4_ = -(uint)(((uVar6 < uVar11) * uVar6 | (uVar6 >= uVar11) * uVar11) == uVar6);
  iVar1 = movmskps(in_EAX,auVar8);
  if ((((iVar1 == 0) && ((params->cParams).minMatch - 3 < 5)) &&
      ((params->cParams).targetLength < 0x20001)) && ((params->cParams).strategy - ZSTD_fast < 9)) {
    memcpy(&zcs->requestedParams,params,0xd0);
    if (cdict != (ZSTD_CDict *)0x0 && dict != (void *)0x0) {
      __assert_fail("!((dict) && (cdict))",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x6735,
                    "size_t ZSTD_initCStream_internal(ZSTD_CStream *, const void *, size_t, const ZSTD_CDict *, const ZSTD_CCtx_params *, unsigned long long)"
                   );
    }
    if (dict == (void *)0x0) {
      ZSTD_clearAllDicts(zcs);
      zcs->cdict = cdict;
    }
    else {
      sVar2 = ZSTD_CCtx_loadDictionary_advanced(zcs,dict,dictSize,ZSTD_dlm_byCopy,ZSTD_dct_auto);
      if (0xffffffffffffff88 < sVar2) {
        return sVar2;
      }
    }
    return 0;
  }
  __assert_fail("!ZSTD_isError(ZSTD_checkCParams(params->cParams))",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x6733,
                "size_t ZSTD_initCStream_internal(ZSTD_CStream *, const void *, size_t, const ZSTD_CDict *, const ZSTD_CCtx_params *, unsigned long long)"
               );
}

Assistant:

size_t ZSTD_initCStream_internal(ZSTD_CStream* zcs,
                    const void* dict, size_t dictSize, const ZSTD_CDict* cdict,
                    const ZSTD_CCtx_params* params,
                    unsigned long long pledgedSrcSize)
{
    DEBUGLOG(4, "ZSTD_initCStream_internal");
    FORWARD_IF_ERROR( ZSTD_CCtx_reset(zcs, ZSTD_reset_session_only) , "");
    FORWARD_IF_ERROR( ZSTD_CCtx_setPledgedSrcSize(zcs, pledgedSrcSize) , "");
    assert(!ZSTD_isError(ZSTD_checkCParams(params->cParams)));
    zcs->requestedParams = *params;
    assert(!((dict) && (cdict)));  /* either dict or cdict, not both */
    if (dict) {
        FORWARD_IF_ERROR( ZSTD_CCtx_loadDictionary(zcs, dict, dictSize) , "");
    } else {
        /* Dictionary is cleared if !cdict */
        FORWARD_IF_ERROR( ZSTD_CCtx_refCDict(zcs, cdict) , "");
    }
    return 0;
}